

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O0

void __thiscall
Diffusion::diffuse_velocity
          (Diffusion *this,Real dt,Real be_cn_theta,MultiFab *rho_half,int rho_flag,
          MultiFab *delta_rhs,int rhsComp,MultiFab **betan,MultiFab *betanCC,MultiFab **betanp1,
          MultiFab *betanp1CC,int betaComp)

{
  char (*in_stack_00000008) [37];
  Print *in_stack_00000010;
  Real run_time;
  int IOProc;
  Real strt_time;
  MultiFab **in_stack_00001f60;
  int in_stack_00001f6c;
  MultiFab *in_stack_00001f70;
  int in_stack_00001f7c;
  MultiFab *in_stack_00001f80;
  Real in_stack_00001f88;
  Real in_stack_00001f90;
  Diffusion *in_stack_00001f98;
  MultiFab *in_stack_00001fd0;
  MultiFab **in_stack_00001fd8;
  MultiFab *in_stack_00001fe0;
  int in_stack_00001fe8;
  char (*in_stack_fffffffffffffc08) [40];
  Print *in_stack_fffffffffffffc10;
  ostream *in_stack_fffffffffffffc38;
  Print *in_stack_fffffffffffffc40;
  Print *in_stack_fffffffffffffc80;
  double local_1f8;
  int local_1ec;
  double local_1e8;
  
  if (verbose != 0) {
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    amrex::Print::operator<<(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    amrex::Print::operator<<(in_stack_fffffffffffffc10,(int *)in_stack_fffffffffffffc08);
    amrex::Print::operator<<
              (in_stack_fffffffffffffc10,
               (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                *)in_stack_fffffffffffffc08);
    amrex::Print::~Print(in_stack_fffffffffffffc80);
  }
  local_1e8 = amrex::ParallelDescriptor::second();
  diffuse_tensor_velocity
            (in_stack_00001f98,in_stack_00001f90,in_stack_00001f88,in_stack_00001f80,
             in_stack_00001f7c,in_stack_00001f70,in_stack_00001f6c,in_stack_00001f60,
             in_stack_00001fd0,in_stack_00001fd8,in_stack_00001fe0,in_stack_00001fe8);
  if (verbose != 0) {
    local_1ec = amrex::ParallelDescriptor::IOProcessorNumber();
    local_1f8 = amrex::ParallelDescriptor::second();
    local_1f8 = local_1f8 - local_1e8;
    amrex::ParallelDescriptor::ReduceRealMax<double>(&local_1f8,local_1ec);
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    amrex::Print::operator<<(in_stack_00000010,in_stack_00000008);
    amrex::Print::operator<<(in_stack_00000010,(int *)in_stack_00000008);
    amrex::Print::operator<<(in_stack_00000010,(char (*) [9])in_stack_00000008);
    amrex::Print::operator<<(in_stack_00000010,(double *)in_stack_00000008);
    amrex::Print::operator<<(in_stack_00000010,*in_stack_00000008);
    amrex::Print::~Print(in_stack_fffffffffffffc80);
  }
  return;
}

Assistant:

void
Diffusion::diffuse_velocity (Real                   dt,
                             Real                   be_cn_theta,
                             const MultiFab&        rho_half,
                             int                    rho_flag,
                             MultiFab*              delta_rhs,
                             int                    rhsComp,
                             const MultiFab* const* betan,
                             const MultiFab* const  betanCC,
                             const MultiFab* const* betanp1,
                             const MultiFab* const  betanp1CC,
                             int                    betaComp)
{
  if (verbose) amrex::Print() << "... Diffusion::diffuse_velocity() lev: " << level << std::endl;

    const Real strt_time = ParallelDescriptor::second();

    diffuse_tensor_velocity(dt,be_cn_theta,rho_half,rho_flag,
                            delta_rhs,rhsComp,betan,betanCC,betanp1,betanp1CC,betaComp);

    if (verbose)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - strt_time;

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

        amrex::Print() << "Diffusion::diffuse_velocity(): lev: " << level
                       << ", time: " << run_time << '\n';
    }
}